

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline(InnerProduct_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _func_int *p_Var5;
  int *piVar6;
  Allocator *pAVar7;
  size_t sVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  undefined8 uVar22;
  int iVar23;
  uint _w;
  Layer *pLVar24;
  long lVar25;
  void *pvVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  undefined1 (*pauVar35) [64];
  long lVar36;
  undefined4 *puVar37;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  void *pvVar42;
  undefined4 *puVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  Mat *this_01;
  long lVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  long lVar52;
  void *pvVar53;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  ParamDict pd;
  void *local_190;
  void *local_188;
  void *local_178;
  void *local_170;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  void *local_130;
  void *local_120;
  uint local_108;
  Mat local_f0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pLVar24 = create_layer(0xe);
  this->flatten = pLVar24;
  ParamDict::ParamDict((ParamDict *)&local_f0);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_f0);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_f0);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar23 = cpu_support_x86_f16c();
  if ((iVar23 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  p_Var5 = this->_vptr_InnerProduct_x86_avx512[-3];
  this_01 = (Mat *)(&this->field_0x130 + (long)p_Var5);
  uVar34 = *(uint *)(&this->field_0xd0 + (long)p_Var5);
  uVar51 = (ulong)uVar34;
  iVar23 = *(int *)(&this->field_0xd8 + (long)p_Var5);
  _w = iVar23 / (int)uVar34;
  this_00 = &this->weight_data_tm;
  if (opt->use_packing_layout == true) {
    if ((uVar34 & 0xf) == 0) {
      Mat::reshape(&local_f0,this_01,_w,uVar34,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)uVar34 >> 4,0x40,0x10,(Allocator *)0x0);
      if (0xf < (int)uVar34) {
        lVar32 = 1;
        lVar46 = 2;
        local_78 = 9;
        local_80 = 8;
        local_88 = 7;
        local_90 = 6;
        local_98 = 5;
        local_a0 = 4;
        local_a8 = 3;
        lVar38 = 0xd;
        uVar40 = 0;
        lVar45 = 10;
        lVar50 = 0xe;
        lVar25 = 0xb;
        lVar30 = 0xf;
        lVar31 = 0xc;
        do {
          local_50 = lVar31;
          local_38 = lVar30;
          local_58 = lVar25;
          local_40 = lVar50;
          local_60 = lVar45;
          local_68 = uVar40;
          local_48 = lVar38;
          pauVar35 = (undefined1 (*) [64])
                     ((long)(this->weight_data_tm).w * (local_68 >> 4) *
                      (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          lVar38 = (long)local_f0.w;
          if ((int)_w < 0x10) {
            lVar38 = local_f0.elemsize * lVar38;
            local_160 = (void *)(lVar38 * local_68 + (long)local_f0.data);
            local_158 = (void *)((local_68 | 1) * lVar38 + (long)local_f0.data);
            pvVar42 = (void *)((local_68 | 2) * lVar38 + (long)local_f0.data);
            pvVar26 = (void *)((local_68 | 3) * lVar38 + (long)local_f0.data);
            local_188 = (void *)((local_68 | 4) * lVar38 + (long)local_f0.data);
            local_150 = (void *)((local_68 | 5) * lVar38 + (long)local_f0.data);
            pvVar53 = (void *)((local_68 | 6) * lVar38 + (long)local_f0.data);
            local_190 = (void *)((local_68 | 7) * lVar38 + (long)local_f0.data);
            local_148 = (void *)((local_68 | 8) * lVar38 + (long)local_f0.data);
            local_120 = (void *)((local_68 | 9) * lVar38 + (long)local_f0.data);
            local_138 = (void *)((local_68 | 10) * lVar38 + (long)local_f0.data);
            local_178 = (void *)((local_68 | 0xb) * lVar38 + (long)local_f0.data);
            local_140 = (void *)((local_68 | 0xc) * lVar38 + (long)local_f0.data);
            local_170 = (void *)((local_68 | 0xd) * lVar38 + (long)local_f0.data);
            local_130 = (void *)((local_68 | 0xe) * lVar38 + (long)local_f0.data);
            local_70 = (void *)(lVar38 * (local_68 | 0xf) + (long)local_f0.data);
            uVar34 = 0;
          }
          else {
            lVar49 = local_f0.elemsize * local_68 * lVar38;
            lVar33 = local_f0.elemsize * lVar32 * lVar38;
            lVar45 = local_f0.elemsize * lVar46 * lVar38;
            lVar31 = local_f0.elemsize * local_38 * lVar38;
            lVar36 = local_f0.elemsize * local_40 * lVar38;
            lVar50 = local_f0.elemsize * local_48 * lVar38;
            lVar48 = local_f0.elemsize * local_50 * lVar38;
            lVar25 = local_f0.elemsize * local_58 * lVar38;
            lVar30 = local_f0.elemsize * local_60 * lVar38;
            lVar44 = local_f0.elemsize * local_78 * lVar38;
            lVar29 = local_f0.elemsize * local_80 * lVar38;
            lVar28 = local_f0.elemsize * local_88 * lVar38;
            lVar52 = local_f0.elemsize * local_90 * lVar38;
            lVar47 = local_f0.elemsize * local_98 * lVar38;
            lVar27 = local_f0.elemsize * local_a0 * lVar38;
            lVar38 = local_f0.elemsize * local_a8 * lVar38;
            iVar23 = 0xf;
            pvVar26 = local_f0.data;
            do {
              auVar78 = *(undefined1 (*) [64])((long)pvVar26 + lVar49);
              auVar79 = *(undefined1 (*) [64])((long)pvVar26 + lVar33);
              auVar80 = *(undefined1 (*) [64])((long)pvVar26 + lVar45);
              auVar81 = *(undefined1 (*) [64])((long)pvVar26 + lVar38);
              auVar82 = *(undefined1 (*) [64])((long)pvVar26 + lVar27);
              auVar83 = *(undefined1 (*) [64])((long)pvVar26 + lVar47);
              auVar84 = *(undefined1 (*) [64])((long)pvVar26 + lVar52);
              auVar85 = *(undefined1 (*) [64])((long)pvVar26 + lVar28);
              auVar77 = *(undefined1 (*) [64])((long)pvVar26 + lVar29);
              auVar86 = *(undefined1 (*) [64])((long)pvVar26 + lVar44);
              auVar87 = *(undefined1 (*) [64])((long)pvVar26 + lVar30);
              auVar88 = *(undefined1 (*) [64])((long)pvVar26 + lVar25);
              auVar66 = *(undefined1 (*) [64])((long)pvVar26 + lVar48);
              auVar67 = *(undefined1 (*) [64])((long)pvVar26 + lVar50);
              auVar68 = *(undefined1 (*) [64])((long)pvVar26 + lVar36);
              auVar69 = *(undefined1 (*) [64])((long)pvVar26 + lVar31);
              auVar65 = vunpcklps_avx512f(auVar78,auVar79);
              auVar78 = vunpckhps_avx512f(auVar78,auVar79);
              auVar79 = vunpcklps_avx512f(auVar80,auVar81);
              auVar80 = vunpckhps_avx512f(auVar80,auVar81);
              auVar81 = vunpcklps_avx512f(auVar82,auVar83);
              auVar82 = vunpckhps_avx512f(auVar82,auVar83);
              auVar83 = vunpcklps_avx512f(auVar84,auVar85);
              auVar84 = vunpckhps_avx512f(auVar84,auVar85);
              auVar85 = vunpcklps_avx512f(auVar77,auVar86);
              auVar77 = vunpckhps_avx512f(auVar77,auVar86);
              auVar86 = vunpcklps_avx512f(auVar87,auVar88);
              auVar87 = vunpckhps_avx512f(auVar87,auVar88);
              auVar88 = vunpcklps_avx512f(auVar66,auVar67);
              auVar66 = vunpckhps_avx512f(auVar66,auVar67);
              auVar67 = vunpcklps_avx512f(auVar68,auVar69);
              auVar68 = vunpckhps_avx512f(auVar68,auVar69);
              auVar69 = vunpcklpd_avx512f(auVar65,auVar79);
              auVar79 = vunpckhpd_avx512f(auVar65,auVar79);
              auVar65 = vunpcklpd_avx512f(auVar78,auVar80);
              auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
              auVar80 = vunpcklpd_avx512f(auVar81,auVar83);
              auVar81 = vunpckhpd_avx512f(auVar81,auVar83);
              auVar83 = vunpcklpd_avx512f(auVar82,auVar84);
              auVar82 = vunpckhpd_avx512f(auVar82,auVar84);
              auVar84 = vunpcklpd_avx512f(auVar85,auVar86);
              auVar85 = vunpckhpd_avx512f(auVar85,auVar86);
              auVar86 = vunpcklpd_avx512f(auVar77,auVar87);
              auVar77 = vunpckhpd_avx512f(auVar77,auVar87);
              auVar87 = vunpcklpd_avx512f(auVar88,auVar67);
              auVar88 = vunpckhpd_avx512f(auVar88,auVar67);
              auVar67 = vunpcklpd_avx512f(auVar66,auVar68);
              auVar66 = vunpckhpd_avx512f(auVar66,auVar68);
              auVar68 = vshuff64x2_avx512f(auVar69,auVar80,0x88);
              auVar70 = vshuff64x2_avx512f(auVar84,auVar87,0x88);
              auVar71 = vshuff64x2_avx512f(auVar79,auVar81,0x88);
              auVar72 = vshuff64x2_avx512f(auVar85,auVar88,0x88);
              auVar73 = vshuff64x2_avx512f(auVar65,auVar83,0x88);
              auVar74 = vshuff64x2_avx512f(auVar86,auVar67,0x88);
              auVar75 = vshuff64x2_avx512f(auVar78,auVar82,0x88);
              auVar76 = vshuff64x2_avx512f(auVar77,auVar66,0x88);
              auVar80 = vshuff64x2_avx512f(auVar69,auVar80,0xdd);
              auVar84 = vshuff64x2_avx512f(auVar84,auVar87,0xdd);
              auVar79 = vshuff64x2_avx512f(auVar79,auVar81,0xdd);
              auVar81 = vshuff64x2_avx512f(auVar85,auVar88,0xdd);
              auVar83 = vshuff64x2_avx512f(auVar65,auVar83,0xdd);
              auVar85 = vshuff64x2_avx512f(auVar86,auVar67,0xdd);
              auVar78 = vshuff64x2_avx512f(auVar78,auVar82,0xdd);
              auVar82 = vshuff64x2_avx512f(auVar77,auVar66,0xdd);
              auVar77 = vshuff64x2_avx512f(auVar68,auVar70,0x88);
              auVar86 = vshuff64x2_avx512f(auVar71,auVar72,0x88);
              auVar87 = vshuff64x2_avx512f(auVar73,auVar74,0x88);
              auVar88 = vshuff64x2_avx512f(auVar75,auVar76,0x88);
              auVar66 = vshuff64x2_avx512f(auVar80,auVar84,0x88);
              auVar67 = vshuff64x2_avx512f(auVar79,auVar81,0x88);
              auVar69 = vshuff64x2_avx512f(auVar83,auVar85,0x88);
              auVar65 = vshuff64x2_avx512f(auVar78,auVar82,0x88);
              auVar68 = vshuff64x2_avx512f(auVar68,auVar70,0xdd);
              auVar70 = vshuff64x2_avx512f(auVar71,auVar72,0xdd);
              auVar71 = vshuff64x2_avx512f(auVar73,auVar74,0xdd);
              auVar72 = vshuff64x2_avx512f(auVar75,auVar76,0xdd);
              auVar80 = vshuff64x2_avx512f(auVar80,auVar84,0xdd);
              auVar79 = vshuff64x2_avx512f(auVar79,auVar81,0xdd);
              auVar81 = vshuff64x2_avx512f(auVar83,auVar85,0xdd);
              auVar78 = vshuff64x2_avx512f(auVar78,auVar82,0xdd);
              *pauVar35 = auVar77;
              pauVar35[1] = auVar86;
              pauVar35[2] = auVar87;
              pauVar35[3] = auVar88;
              pauVar35[4] = auVar66;
              pauVar35[5] = auVar67;
              pauVar35[6] = auVar69;
              pauVar35[7] = auVar65;
              pauVar35[8] = auVar68;
              pauVar35[9] = auVar70;
              pauVar35[10] = auVar71;
              pauVar35[0xb] = auVar72;
              pauVar35[0xc] = auVar80;
              pauVar35[0xd] = auVar79;
              pauVar35[0xe] = auVar81;
              pauVar35[0xf] = auVar78;
              pauVar35 = pauVar35 + 0x10;
              pvVar26 = (void *)((long)pvVar26 + 0x40);
              iVar23 = iVar23 + 0x10;
            } while (iVar23 < (int)_w);
            local_160 = (void *)(lVar49 + (long)pvVar26);
            local_158 = (void *)(lVar33 + (long)pvVar26);
            pvVar42 = (void *)(lVar45 + (long)pvVar26);
            local_70 = (void *)(lVar31 + (long)pvVar26);
            local_130 = (void *)(lVar36 + (long)pvVar26);
            local_170 = (void *)(lVar50 + (long)pvVar26);
            local_140 = (void *)(lVar48 + (long)pvVar26);
            local_178 = (void *)(lVar25 + (long)pvVar26);
            local_138 = (void *)(lVar30 + (long)pvVar26);
            local_120 = (void *)(lVar44 + (long)pvVar26);
            local_148 = (void *)(lVar29 + (long)pvVar26);
            local_190 = (void *)(lVar28 + (long)pvVar26);
            pvVar53 = (void *)(lVar52 + (long)pvVar26);
            local_150 = (void *)(lVar47 + (long)pvVar26);
            local_188 = (void *)(lVar27 + (long)pvVar26);
            pvVar26 = (void *)(lVar38 + (long)pvVar26);
            uVar34 = _w & 0xfffffff0;
          }
          if ((int)(uVar34 | 7) < (int)_w) {
            lVar38 = 0;
            uVar39 = uVar34;
            do {
              auVar54 = vunpcklps_avx512vl(*(undefined1 (*) [32])((long)local_160 + lVar38),
                                           *(undefined1 (*) [32])((long)local_158 + lVar38));
              auVar18 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_160 + lVar38),
                                      *(undefined1 (*) [32])((long)local_158 + lVar38));
              auVar20 = vunpcklps_avx(*(undefined1 (*) [32])((long)pvVar42 + lVar38),
                                      *(undefined1 (*) [32])((long)pvVar26 + lVar38));
              auVar9 = vunpckhps_avx(*(undefined1 (*) [32])((long)pvVar42 + lVar38),
                                     *(undefined1 (*) [32])((long)pvVar26 + lVar38));
              auVar64 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_188 + lVar38),
                                      *(undefined1 (*) [32])((long)local_150 + lVar38));
              auVar10 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_188 + lVar38),
                                      *(undefined1 (*) [32])((long)local_150 + lVar38));
              auVar89 = vunpcklps_avx(*(undefined1 (*) [32])((long)pvVar53 + lVar38),
                                      *(undefined1 (*) [32])((long)local_190 + lVar38));
              auVar11 = vunpckhps_avx(*(undefined1 (*) [32])((long)pvVar53 + lVar38),
                                      *(undefined1 (*) [32])((long)local_190 + lVar38));
              auVar90 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_148 + lVar38),
                                      *(undefined1 (*) [32])((long)local_120 + lVar38));
              auVar12 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_148 + lVar38),
                                      *(undefined1 (*) [32])((long)local_120 + lVar38));
              auVar91 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_138 + lVar38),
                                      *(undefined1 (*) [32])((long)local_178 + lVar38));
              auVar13 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_138 + lVar38),
                                      *(undefined1 (*) [32])((long)local_178 + lVar38));
              auVar17 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_140 + lVar38),
                                      *(undefined1 (*) [32])((long)local_170 + lVar38));
              auVar19 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_140 + lVar38),
                                      *(undefined1 (*) [32])((long)local_170 + lVar38));
              auVar57 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_130 + lVar38),
                                      *(undefined1 (*) [32])((long)local_70 + lVar38));
              auVar14 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_130 + lVar38),
                                      *(undefined1 (*) [32])((long)local_70 + lVar38));
              auVar55 = vunpcklpd_avx512vl(auVar54,auVar20);
              auVar54 = vunpckhpd_avx512vl(auVar54,auVar20);
              auVar56 = vunpcklpd_avx512vl(auVar18,auVar9);
              auVar18 = vunpckhpd_avx(auVar18,auVar9);
              auVar20 = vunpcklpd_avx(auVar64,auVar89);
              auVar9 = vunpckhpd_avx(auVar64,auVar89);
              auVar64 = vunpcklpd_avx(auVar10,auVar11);
              auVar10 = vunpckhpd_avx(auVar10,auVar11);
              auVar89 = vunpcklpd_avx(auVar90,auVar91);
              auVar11 = vunpckhpd_avx(auVar90,auVar91);
              auVar90 = vunpcklpd_avx(auVar12,auVar13);
              auVar12 = vunpckhpd_avx(auVar12,auVar13);
              auVar91 = vunpcklpd_avx(auVar17,auVar57);
              auVar13 = vunpckhpd_avx(auVar17,auVar57);
              auVar17 = vunpcklpd_avx(auVar19,auVar14);
              auVar19 = vunpckhpd_avx(auVar19,auVar14);
              auVar92._16_16_ = auVar20._0_16_;
              auVar92._0_16_ = auVar55._0_16_;
              auVar57 = vinsertf32x4_avx512vl(auVar89,auVar91._0_16_,1);
              auVar58 = vinsertf32x4_avx512vl(auVar54,auVar9._0_16_,1);
              auVar59 = vinsertf32x4_avx512vl(auVar11,auVar13._0_16_,1);
              auVar60 = vinsertf32x4_avx512vl(auVar56,auVar64._0_16_,1);
              auVar61 = vinsertf32x4_avx512vl(auVar90,auVar17._0_16_,1);
              auVar62 = vinsertf32x4_avx512vl(auVar18,auVar10._0_16_,1);
              auVar63 = vinsertf32x4_avx512vl(auVar12,auVar19._0_16_,1);
              auVar14 = vperm2f128_avx(auVar55,auVar20,0x31);
              auVar20 = vperm2f128_avx(auVar89,auVar91,0x31);
              auVar9 = vperm2f128_avx(auVar54,auVar9,0x31);
              auVar11 = vperm2f128_avx(auVar11,auVar13,0x31);
              auVar64 = vshuff64x2_avx512vl(auVar56,auVar64,3);
              auVar13 = vperm2f128_avx(auVar90,auVar17,0x31);
              auVar18 = vperm2f128_avx(auVar18,auVar10,0x31);
              auVar10 = vperm2f128_avx(auVar12,auVar19,0x31);
              *(undefined1 (*) [32])*pauVar35 = auVar92;
              *(undefined1 (*) [32])((long)*pauVar35 + 0x20) = auVar57;
              *(undefined1 (*) [32])pauVar35[1] = auVar58;
              *(undefined1 (*) [32])(pauVar35[1] + 0x20) = auVar59;
              *(undefined1 (*) [32])pauVar35[2] = auVar60;
              *(undefined1 (*) [32])(pauVar35[2] + 0x20) = auVar61;
              *(undefined1 (*) [32])pauVar35[3] = auVar62;
              *(undefined1 (*) [32])(pauVar35[3] + 0x20) = auVar63;
              *(undefined1 (*) [32])pauVar35[4] = auVar14;
              *(undefined1 (*) [32])(pauVar35[4] + 0x20) = auVar20;
              *(undefined1 (*) [32])pauVar35[5] = auVar9;
              *(undefined1 (*) [32])(pauVar35[5] + 0x20) = auVar11;
              *(undefined1 (*) [32])pauVar35[6] = auVar64;
              *(undefined1 (*) [32])(pauVar35[6] + 0x20) = auVar13;
              *(undefined1 (*) [32])pauVar35[7] = auVar18;
              *(undefined1 (*) [32])(pauVar35[7] + 0x20) = auVar10;
              pauVar35 = pauVar35 + 8;
              uVar34 = uVar39 + 8;
              lVar38 = lVar38 + 0x20;
              iVar23 = uVar39 + 0xf;
              uVar39 = uVar34;
            } while (iVar23 < (int)_w);
            local_160 = (void *)((long)local_160 + lVar38);
            local_158 = (void *)((long)local_158 + lVar38);
            pvVar42 = (void *)((long)pvVar42 + lVar38);
            local_70 = (void *)((long)local_70 + lVar38);
            local_130 = (void *)((long)local_130 + lVar38);
            local_170 = (void *)((long)local_170 + lVar38);
            local_140 = (void *)((long)local_140 + lVar38);
            local_178 = (void *)((long)local_178 + lVar38);
            local_138 = (void *)((long)local_138 + lVar38);
            local_120 = (void *)((long)local_120 + lVar38);
            local_148 = (void *)((long)local_148 + lVar38);
            local_190 = (void *)((long)local_190 + lVar38);
            pvVar53 = (void *)((long)pvVar53 + lVar38);
            local_150 = (void *)((long)local_150 + lVar38);
            local_188 = (void *)((long)local_188 + lVar38);
            pvVar26 = (void *)((long)pvVar26 + lVar38);
          }
          if ((int)uVar34 < (int)_w) {
            lVar38 = 0;
            do {
              *(undefined4 *)*pauVar35 = *(undefined4 *)((long)local_160 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 4) = *(undefined4 *)((long)local_158 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 8) = *(undefined4 *)((long)pvVar42 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0xc) = *(undefined4 *)((long)pvVar26 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x10) =
                   *(undefined4 *)((long)local_188 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x14) =
                   *(undefined4 *)((long)local_150 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x18) = *(undefined4 *)((long)pvVar53 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x1c) =
                   *(undefined4 *)((long)local_190 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x20) =
                   *(undefined4 *)((long)local_148 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x24) =
                   *(undefined4 *)((long)local_120 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x28) =
                   *(undefined4 *)((long)local_138 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x2c) =
                   *(undefined4 *)((long)local_178 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x30) =
                   *(undefined4 *)((long)local_140 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x34) =
                   *(undefined4 *)((long)local_170 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x38) =
                   *(undefined4 *)((long)local_130 + lVar38 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x3c) = *(undefined4 *)((long)local_70 + lVar38 * 4)
              ;
              pauVar35 = pauVar35 + 1;
              lVar38 = lVar38 + 1;
            } while (_w - uVar34 != (int)lVar38);
          }
          lVar32 = lVar32 + 0x10;
          lVar46 = lVar46 + 0x10;
          local_78 = local_78 + 0x10;
          local_80 = local_80 + 0x10;
          local_88 = local_88 + 0x10;
          local_90 = local_90 + 0x10;
          local_98 = local_98 + 0x10;
          local_a0 = local_a0 + 0x10;
          local_a8 = local_a8 + 0x10;
          lVar38 = local_48 + 0x10;
          uVar40 = local_68 + 0x10;
          lVar45 = local_60 + 0x10;
          lVar50 = local_40 + 0x10;
          lVar25 = local_58 + 0x10;
          lVar30 = local_38 + 0x10;
          lVar31 = local_50 + 0x10;
        } while (local_68 + 0x1f < uVar51);
      }
      if (local_f0.refcount == (int *)0x0) goto LAB_002a04ca;
      LOCK();
      *local_f0.refcount = *local_f0.refcount + -1;
      UNLOCK();
      if (*local_f0.refcount != 0) goto LAB_002a04ca;
      if (local_f0.allocator != (Allocator *)0x0) {
        (*(local_f0.allocator)->_vptr_Allocator[3])();
        goto LAB_002a04ca;
      }
    }
    else if ((uVar34 & 7) == 0) {
      Mat::reshape(&local_f0,this_01,_w,uVar34,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)uVar34 >> 3,0x20,8,(Allocator *)0x0);
      if (7 < (int)uVar34) {
        local_108 = _w & 0xfffffff0;
        lVar50 = 7;
        lVar25 = 6;
        lVar38 = 5;
        lVar45 = 4;
        local_178 = (void *)0x3;
        local_158 = (void *)0x2;
        local_140 = (void *)0x1;
        local_148 = (void *)0x0;
        uVar40 = 0;
        do {
          lVar30 = (long)(this->weight_data_tm).w;
          pvVar26 = (this->weight_data_tm).data;
          sVar8 = (this->weight_data_tm).elemsize;
          puVar43 = (undefined4 *)((uVar40 >> 3) * lVar30 * sVar8 + (long)pvVar26);
          lVar31 = (long)local_f0.w;
          if ((int)_w < 0x10) {
            lVar31 = local_f0.elemsize * lVar31;
            lVar49 = lVar31 * uVar40;
            lVar33 = (uVar40 | 1) * lVar31;
            lVar29 = (uVar40 | 2) * lVar31;
            lVar28 = (uVar40 | 3) * lVar31;
            lVar27 = (uVar40 | 4) * lVar31;
            lVar36 = (uVar40 | 5) * lVar31;
            lVar46 = (uVar40 | 6) * lVar31;
            lVar32 = lVar31 * (uVar40 | 7);
            uVar34 = 0;
          }
          else {
            lVar32 = local_f0.elemsize * lVar50 * lVar31;
            lVar46 = local_f0.elemsize * lVar25 * lVar31;
            lVar36 = local_f0.elemsize * lVar38 * lVar31;
            lVar27 = local_f0.elemsize * lVar45 * lVar31;
            lVar28 = local_f0.elemsize * (long)local_178 * lVar31;
            lVar29 = local_f0.elemsize * (long)local_158 * lVar31;
            lVar33 = local_f0.elemsize * (long)local_140 * lVar31;
            lVar31 = local_f0.elemsize * uVar40 * lVar31;
            lVar30 = sVar8 * (long)local_148 * lVar30;
            iVar23 = 0xf;
            lVar49 = 0;
            do {
              auVar78 = *(undefined1 (*) [64])((long)local_f0.data + lVar49 + lVar31);
              auVar79 = *(undefined1 (*) [64])((long)local_f0.data + lVar49 + lVar33);
              auVar80 = *(undefined1 (*) [64])((long)local_f0.data + lVar49 + lVar29);
              auVar81 = *(undefined1 (*) [64])((long)local_f0.data + lVar49 + lVar28);
              auVar82 = *(undefined1 (*) [64])((long)local_f0.data + lVar49 + lVar27);
              auVar83 = *(undefined1 (*) [64])((long)local_f0.data + lVar49 + lVar36);
              auVar84 = *(undefined1 (*) [64])((long)local_f0.data + lVar49 + lVar46);
              auVar85 = *(undefined1 (*) [64])((long)local_f0.data + lVar49 + lVar32);
              auVar77 = vunpcklps_avx512f(auVar78,auVar79);
              auVar78 = vunpckhps_avx512f(auVar78,auVar79);
              auVar79 = vunpcklps_avx512f(auVar80,auVar81);
              auVar80 = vunpckhps_avx512f(auVar80,auVar81);
              auVar81 = vunpcklps_avx512f(auVar82,auVar83);
              auVar82 = vunpckhps_avx512f(auVar82,auVar83);
              auVar83 = vunpcklps_avx512f(auVar84,auVar85);
              auVar84 = vunpckhps_avx512f(auVar84,auVar85);
              auVar85 = vunpcklpd_avx512f(auVar77,auVar79);
              auVar79 = vunpckhpd_avx512f(auVar77,auVar79);
              auVar77 = vunpcklpd_avx512f(auVar78,auVar80);
              auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
              auVar80 = vunpcklpd_avx512f(auVar81,auVar83);
              auVar81 = vunpckhpd_avx512f(auVar81,auVar83);
              auVar83 = vunpcklpd_avx512f(auVar82,auVar84);
              auVar82 = vunpckhpd_avx512f(auVar82,auVar84);
              auVar84 = vshuff64x2_avx512f(auVar85,auVar80,0x88);
              auVar86 = vshuff64x2_avx512f(auVar79,auVar81,0x88);
              auVar87 = vshuff64x2_avx512f(auVar77,auVar83,0x88);
              auVar88 = vshuff64x2_avx512f(auVar78,auVar82,0x88);
              auVar80 = vshuff64x2_avx512f(auVar85,auVar80,0xdd);
              auVar79 = vshuff64x2_avx512f(auVar79,auVar81,0xdd);
              auVar81 = vshuff64x2_avx512f(auVar77,auVar83,0xdd);
              auVar78 = vshuff64x2_avx512f(auVar78,auVar82,0xdd);
              auVar82 = vshuff64x2_avx512f(auVar84,auVar86,0x88);
              auVar83 = vshuff64x2_avx512f(auVar87,auVar88,0x88);
              auVar85 = vshuff64x2_avx512f(auVar80,auVar79,0x88);
              auVar77 = vshuff64x2_avx512f(auVar81,auVar78,0x88);
              auVar84 = vshuff64x2_avx512f(auVar84,auVar86,0xdd);
              auVar86 = vshuff64x2_avx512f(auVar87,auVar88,0xdd);
              auVar79 = vshuff64x2_avx512f(auVar80,auVar79,0xdd);
              auVar78 = vshuff64x2_avx512f(auVar81,auVar78,0xdd);
              *(undefined1 (*) [64])((long)pvVar26 + lVar49 * 8 + lVar30) = auVar82;
              *(undefined1 (*) [64])((long)pvVar26 + lVar49 * 8 + lVar30 + 0x40) = auVar83;
              *(undefined1 (*) [64])((long)pvVar26 + lVar49 * 8 + lVar30 + 0x80) = auVar85;
              *(undefined1 (*) [64])((long)pvVar26 + lVar49 * 8 + lVar30 + 0xc0) = auVar77;
              *(undefined1 (*) [64])((long)pvVar26 + lVar49 * 8 + lVar30 + 0x100) = auVar84;
              *(undefined1 (*) [64])((long)pvVar26 + lVar49 * 8 + lVar30 + 0x140) = auVar86;
              *(undefined1 (*) [64])((long)pvVar26 + lVar49 * 8 + lVar30 + 0x180) = auVar79;
              *(undefined1 (*) [64])((long)pvVar26 + lVar49 * 8 + lVar30 + 0x1c0) = auVar78;
              puVar43 = puVar43 + 0x80;
              iVar23 = iVar23 + 0x10;
              lVar49 = lVar49 + 0x40;
            } while (iVar23 < (int)_w);
            lVar32 = lVar32 + lVar49;
            lVar46 = lVar46 + lVar49;
            lVar36 = lVar36 + lVar49;
            lVar27 = lVar27 + lVar49;
            lVar28 = lVar28 + lVar49;
            lVar29 = lVar29 + lVar49;
            lVar33 = lVar33 + lVar49;
            lVar49 = lVar31 + lVar49;
            uVar34 = local_108;
          }
          local_188 = (void *)((long)local_f0.data + lVar29);
          lVar32 = (long)local_f0.data + lVar32;
          lVar49 = (long)local_f0.data + lVar49;
          lVar28 = (long)local_f0.data + lVar28;
          lVar33 = (long)local_f0.data + lVar33;
          lVar27 = (long)local_f0.data + lVar27;
          lVar36 = (long)local_f0.data + lVar36;
          lVar46 = (long)local_f0.data + lVar46;
          if ((int)(uVar34 | 7) < (int)_w) {
            lVar30 = 0;
            puVar37 = puVar43;
            uVar39 = uVar34;
            do {
              auVar18 = vunpcklps_avx(*(undefined1 (*) [32])(lVar49 + lVar30),
                                      *(undefined1 (*) [32])(lVar33 + lVar30));
              auVar9 = vunpckhps_avx(*(undefined1 (*) [32])(lVar49 + lVar30),
                                     *(undefined1 (*) [32])(lVar33 + lVar30));
              auVar19 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_188 + lVar30),
                                      *(undefined1 (*) [32])(lVar28 + lVar30));
              auVar10 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_188 + lVar30),
                                      *(undefined1 (*) [32])(lVar28 + lVar30));
              auVar20 = vunpcklps_avx(*(undefined1 (*) [32])(lVar27 + lVar30),
                                      *(undefined1 (*) [32])(lVar36 + lVar30));
              auVar11 = vunpckhps_avx(*(undefined1 (*) [32])(lVar27 + lVar30),
                                      *(undefined1 (*) [32])(lVar36 + lVar30));
              auVar64 = vunpcklps_avx(*(undefined1 (*) [32])(lVar46 + lVar30),
                                      *(undefined1 (*) [32])(lVar32 + lVar30));
              auVar12 = vunpckhps_avx(*(undefined1 (*) [32])(lVar46 + lVar30),
                                      *(undefined1 (*) [32])(lVar32 + lVar30));
              auVar13 = vunpcklpd_avx(auVar18,auVar19);
              auVar18 = vunpckhpd_avx(auVar18,auVar19);
              auVar19 = vunpcklpd_avx(auVar9,auVar10);
              auVar9 = vunpckhpd_avx(auVar9,auVar10);
              auVar14 = vunpcklpd_avx(auVar20,auVar64);
              auVar10 = vunpckhpd_avx(auVar20,auVar64);
              auVar20 = vunpcklpd_avx(auVar11,auVar12);
              auVar11 = vunpckhpd_avx(auVar11,auVar12);
              auVar64._16_16_ = auVar14._0_16_;
              auVar64._0_16_ = auVar13._0_16_;
              auVar89._16_16_ = auVar10._0_16_;
              auVar89._0_16_ = auVar18._0_16_;
              auVar90._16_16_ = auVar20._0_16_;
              auVar90._0_16_ = auVar19._0_16_;
              auVar91._16_16_ = auVar11._0_16_;
              auVar91._0_16_ = auVar9._0_16_;
              auVar12 = vperm2f128_avx(auVar13,auVar14,0x31);
              auVar18 = vperm2f128_avx(auVar18,auVar10,0x31);
              auVar10 = vperm2f128_avx(auVar19,auVar20,0x31);
              auVar9 = vperm2f128_avx(auVar9,auVar11,0x31);
              *(undefined1 (*) [32])(puVar43 + lVar30 * 2) = auVar64;
              *(undefined1 (*) [32])(puVar43 + lVar30 * 2 + 8) = auVar89;
              *(undefined1 (*) [32])(puVar43 + lVar30 * 2 + 0x10) = auVar90;
              *(undefined1 (*) [32])(puVar43 + lVar30 * 2 + 0x18) = auVar91;
              *(undefined1 (*) [32])(puVar43 + lVar30 * 2 + 0x20) = auVar12;
              *(undefined1 (*) [32])(puVar43 + lVar30 * 2 + 0x28) = auVar18;
              *(undefined1 (*) [32])(puVar43 + lVar30 * 2 + 0x30) = auVar10;
              *(undefined1 (*) [32])(puVar43 + lVar30 * 2 + 0x38) = auVar9;
              puVar37 = puVar37 + 0x40;
              uVar34 = uVar39 + 8;
              iVar23 = uVar39 + 0xf;
              lVar30 = lVar30 + 0x20;
              uVar39 = uVar34;
            } while (iVar23 < (int)_w);
            lVar32 = lVar32 + lVar30;
            lVar46 = lVar46 + lVar30;
            lVar36 = lVar36 + lVar30;
            lVar27 = lVar27 + lVar30;
            lVar28 = lVar28 + lVar30;
            local_188 = (void *)((long)local_188 + lVar30);
            lVar33 = lVar33 + lVar30;
            lVar49 = lVar49 + lVar30;
            puVar43 = puVar37;
          }
          if ((int)uVar34 < (int)_w) {
            lVar30 = 0;
            do {
              *puVar43 = *(undefined4 *)(lVar49 + lVar30 * 4);
              puVar43[1] = *(undefined4 *)(lVar33 + lVar30 * 4);
              puVar43[2] = *(undefined4 *)((long)local_188 + lVar30 * 4);
              puVar43[3] = *(undefined4 *)(lVar28 + lVar30 * 4);
              puVar43[4] = *(undefined4 *)(lVar27 + lVar30 * 4);
              puVar43[5] = *(undefined4 *)(lVar36 + lVar30 * 4);
              puVar43[6] = *(undefined4 *)(lVar46 + lVar30 * 4);
              puVar43[7] = *(undefined4 *)(lVar32 + lVar30 * 4);
              puVar43 = puVar43 + 8;
              lVar30 = lVar30 + 1;
            } while (_w - uVar34 != (int)lVar30);
          }
          uVar41 = uVar40 + 0xf;
          lVar50 = lVar50 + 8;
          lVar25 = lVar25 + 8;
          lVar38 = lVar38 + 8;
          lVar45 = lVar45 + 8;
          local_178 = (void *)((long)local_178 + 8);
          local_158 = (void *)((long)local_158 + 8);
          local_140 = (void *)((long)local_140 + 8);
          local_148 = (void *)((long)local_148 + 1);
          uVar40 = uVar40 + 8;
        } while (uVar41 < uVar51);
      }
      if (local_f0.refcount == (int *)0x0) goto LAB_002a04ca;
      LOCK();
      *local_f0.refcount = *local_f0.refcount + -1;
      UNLOCK();
      if (*local_f0.refcount != 0) goto LAB_002a04ca;
      if (local_f0.allocator != (Allocator *)0x0) {
        (*(local_f0.allocator)->_vptr_Allocator[3])();
        goto LAB_002a04ca;
      }
    }
    else {
      if ((uVar34 & 3) != 0) goto LAB_0029eed5;
      Mat::reshape(&local_f0,this_01,_w,uVar34,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)uVar34 >> 2,0x10,4,(Allocator *)0x0);
      if (3 < (int)uVar34) {
        local_178._0_4_ = _w & 0xfffffffc;
        lVar38 = 3;
        lVar45 = 2;
        lVar50 = 1;
        local_190 = (void *)0x0;
        uVar40 = 0;
        do {
          lVar30 = (long)(this->weight_data_tm).w;
          pvVar26 = (this->weight_data_tm).data;
          sVar8 = (this->weight_data_tm).elemsize;
          puVar43 = (undefined4 *)((uVar40 >> 2) * lVar30 * sVar8 + (long)pvVar26);
          lVar25 = (long)local_f0.w;
          if ((int)_w < 4) {
            lVar25 = local_f0.elemsize * lVar25;
            lVar36 = lVar25 * uVar40;
            lVar46 = (uVar40 | 1) * lVar25;
            lVar32 = (uVar40 | 2) * lVar25;
            lVar31 = lVar25 * (uVar40 | 3);
            uVar34 = 0;
          }
          else {
            lVar31 = local_f0.elemsize * lVar38 * lVar25;
            lVar32 = local_f0.elemsize * lVar45 * lVar25;
            lVar46 = local_f0.elemsize * lVar50 * lVar25;
            lVar25 = local_f0.elemsize * uVar40 * lVar25;
            iVar23 = 3;
            lVar36 = 0;
            do {
              puVar37 = puVar43;
              auVar1 = *(undefined1 (*) [16])((long)local_f0.data + lVar36 + lVar25);
              auVar2 = *(undefined1 (*) [16])((long)local_f0.data + lVar36 + lVar46);
              auVar3 = *(undefined1 (*) [16])((long)local_f0.data + lVar36 + lVar32);
              auVar4 = *(undefined1 (*) [16])((long)local_f0.data + lVar36 + lVar31);
              auVar15 = vunpcklps_avx(auVar1,auVar2);
              auVar16 = vunpcklps_avx(auVar3,auVar4);
              auVar2 = vunpckhps_avx(auVar1,auVar2);
              auVar3 = vunpckhps_avx(auVar3,auVar4);
              auVar4 = vunpcklpd_avx(auVar15,auVar16);
              auVar1 = vunpckhpd_avx(auVar15,auVar16);
              auVar15 = vunpcklpd_avx(auVar2,auVar3);
              auVar2 = vunpckhpd_avx(auVar2,auVar3);
              puVar43 = (undefined4 *)
                        ((long)pvVar26 + lVar36 * 4 + sVar8 * (long)local_190 * lVar30 + 0x40);
              *(undefined1 (*) [16])(puVar43 + -0x10) = auVar4;
              *(undefined1 (*) [16])(puVar43 + -0xc) = auVar1;
              *(undefined1 (*) [16])(puVar43 + -8) = auVar15;
              *(undefined1 (*) [16])(puVar43 + -4) = auVar2;
              iVar23 = iVar23 + 4;
              lVar36 = lVar36 + 0x10;
            } while (iVar23 < (int)_w);
            puVar43 = puVar37 + 0x10;
            lVar31 = lVar31 + lVar36;
            lVar32 = lVar32 + lVar36;
            lVar46 = lVar46 + lVar36;
            lVar36 = lVar25 + lVar36;
            uVar34 = (uint)local_178;
          }
          if ((int)uVar34 < (int)_w) {
            lVar25 = 0;
            do {
              *puVar43 = *(undefined4 *)((long)local_f0.data + lVar25 * 4 + lVar36);
              puVar43[1] = *(undefined4 *)((long)local_f0.data + lVar25 * 4 + lVar46);
              puVar43[2] = *(undefined4 *)((long)local_f0.data + lVar25 * 4 + lVar32);
              puVar43[3] = *(undefined4 *)((long)local_f0.data + lVar25 * 4 + lVar31);
              puVar43 = puVar43 + 4;
              lVar25 = lVar25 + 1;
            } while (_w - uVar34 != (int)lVar25);
          }
          uVar41 = uVar40 + 7;
          lVar38 = lVar38 + 4;
          lVar45 = lVar45 + 4;
          lVar50 = lVar50 + 4;
          local_190 = (void *)((long)local_190 + 1);
          uVar40 = uVar40 + 4;
        } while (uVar41 < uVar51);
      }
      if (local_f0.refcount == (int *)0x0) goto LAB_002a04ca;
      LOCK();
      *local_f0.refcount = *local_f0.refcount + -1;
      UNLOCK();
      if (*local_f0.refcount != 0) goto LAB_002a04ca;
      if (local_f0.allocator != (Allocator *)0x0) {
        (*(local_f0.allocator)->_vptr_Allocator[3])();
        goto LAB_002a04ca;
      }
    }
    if (local_f0.data != (void *)0x0) {
      free(local_f0.data);
    }
  }
  else {
LAB_0029eed5:
    if (p_Var5 != (_func_int *)0xfffffffffffffee0) {
      piVar6 = *(int **)(&this->field_0x138 + (long)p_Var5);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->weight_data_tm).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pvVar26 = (this->weight_data_tm).data;
          pAVar7 = (this->weight_data_tm).allocator;
          if (pAVar7 == (Allocator *)0x0) {
            if (pvVar26 != (void *)0x0) {
              free(pvVar26);
            }
          }
          else {
            (*pAVar7->_vptr_Allocator[3])
                      (pAVar7,pvVar26,(long)iVar23 % (long)(int)uVar34 & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      this_00->data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      piVar6 = *(int **)(&this->field_0x138 + (long)p_Var5);
      (this->weight_data_tm).data = this_01->data;
      (this->weight_data_tm).refcount = piVar6;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var5);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var5);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var5);
      uVar21 = *(undefined8 *)(&this->field_0x158 + (long)p_Var5);
      uVar22 = *(undefined8 *)(&this->field_0x160 + (long)p_Var5);
      (this->weight_data_tm).dims = (int)uVar21;
      (this->weight_data_tm).w = (int)((ulong)uVar21 >> 0x20);
      (this->weight_data_tm).h = (int)uVar22;
      (this->weight_data_tm).d = (int)((ulong)uVar22 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var5);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var5);
    }
  }
LAB_002a04ca:
  if (opt->lightmode == true) {
    p_Var5 = this->_vptr_InnerProduct_x86_avx512[-3];
    piVar6 = *(int **)(&this->field_0x138 + (long)p_Var5);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var5) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var5) != (void *)0x0) {
            free(*(void **)(&this->field_0x130 + (long)p_Var5));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var5) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var5) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var5) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}